

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_rendering_input_attachment_index_info
          (Impl *this,Value *state,VkRenderingInputAttachmentIndexInfoKHR **out_info)

{
  undefined8 uVar1;
  VkRenderingInputAttachmentIndexInfoKHR *pVVar2;
  Type pGVar3;
  Number NVar4;
  uint32_t *puVar5;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar6;
  SizeType *pSVar7;
  ulong uVar8;
  Data local_40;
  
  pVVar2 = (VkRenderingInputAttachmentIndexInfoKHR *)
           ScratchAllocator::allocate_raw(&this->allocator,0x30,0x10);
  if (pVVar2 != (VkRenderingInputAttachmentIndexInfoKHR *)0x0) {
    pVVar2->pDepthInputAttachmentIndex = (uint32_t *)0x0;
    pVVar2->pStencilInputAttachmentIndex = (uint32_t *)0x0;
    *(undefined8 *)&pVVar2->colorAttachmentCount = 0;
    pVVar2->pColorAttachmentInputIndices = (uint32_t *)0x0;
    *(undefined8 *)pVVar2 = 0;
    pVVar2->pNext = (void *)0x0;
  }
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"colorAttachmentCount");
  if ((undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x40000000000000) ==
      (undefined1  [16])0x0) {
LAB_00165380:
    __assert_fail("data_.f.flags & kUintFlag",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x719,
                  "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  pVVar2->colorAttachmentCount = (pGVar3->data_).s.length;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_40.s,(Ch *)state);
  uVar1 = local_40.n;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(state);
  if (uVar1 != NVar4.i64) {
    if ((ulong)pVVar2->colorAttachmentCount == 0) {
      puVar5 = (uint32_t *)0x0;
    }
    else {
      puVar5 = (uint32_t *)
               ScratchAllocator::allocate_raw
                         (&this->allocator,(ulong)pVVar2->colorAttachmentCount << 2,0x10);
      if (pVVar2->colorAttachmentCount != 0) {
        uVar8 = 0;
        local_40.s.str = (Ch *)out_info;
        do {
          pGVar3 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)state,"colorAttachmentInputIndices");
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::operator[](pGVar3,(SizeType)uVar8);
          if ((undefined1  [16])
              ((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x40000000000000) ==
              (undefined1  [16])0x0) goto LAB_00165380;
          puVar5[uVar8] = (pGVar6->data_).s.length;
          uVar8 = uVar8 + 1;
          out_info = (VkRenderingInputAttachmentIndexInfoKHR **)local_40.s.str;
        } while (uVar8 < pVVar2->colorAttachmentCount);
      }
    }
    pVVar2->pColorAttachmentInputIndices = puVar5;
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_40.s,(Ch *)state);
  uVar1 = local_40.n;
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(state);
  if (uVar1 != NVar4.i64) {
    pSVar7 = (SizeType *)ScratchAllocator::allocate_raw(&this->allocator,4,0x10);
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"depthInputAttachmentIndex");
    if ((undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x40000000000000) ==
        (undefined1  [16])0x0) goto LAB_00165380;
    *pSVar7 = (pGVar3->data_).s.length;
    pVVar2->pDepthInputAttachmentIndex = pSVar7;
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_40.s,(Ch *)state);
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(state);
  if (local_40.n.i64 != (Number)NVar4.i64) {
    pSVar7 = (SizeType *)ScratchAllocator::allocate_raw(&this->allocator,4,0x10);
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"stencilInputAttachmentIndex");
    if ((undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x40000000000000) ==
        (undefined1  [16])0x0) goto LAB_00165380;
    *pSVar7 = (pGVar3->data_).s.length;
    pVVar2->pStencilInputAttachmentIndex = pSVar7;
  }
  *out_info = pVVar2;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_rendering_input_attachment_index_info(const Value &state, VkRenderingInputAttachmentIndexInfoKHR **out_info)
{
	auto *info = allocator.allocate_cleared<VkRenderingInputAttachmentIndexInfoKHR>();
	info->colorAttachmentCount = state["colorAttachmentCount"].GetUint();
	if (state.HasMember("colorAttachmentInputIndices"))
	{
		auto *locs = allocator.allocate_n<uint32_t>(info->colorAttachmentCount);
		for (uint32_t i = 0; i < info->colorAttachmentCount; i++)
			locs[i] = state["colorAttachmentInputIndices"][i].GetUint();
		info->pColorAttachmentInputIndices = locs;
	}

	if (state.HasMember("depthInputAttachmentIndex"))
	{
		auto *loc = allocator.allocate<uint32_t>();
		*loc = state["depthInputAttachmentIndex"].GetUint();
		info->pDepthInputAttachmentIndex = loc;
	}

	if (state.HasMember("stencilInputAttachmentIndex"))
	{
		auto *loc = allocator.allocate<uint32_t>();
		*loc = state["stencilInputAttachmentIndex"].GetUint();
		info->pStencilInputAttachmentIndex = loc;
	}

	*out_info = info;
	return true;
}